

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottieitem.cpp
# Opt level: O2

void __thiscall
rlottie::internal::renderer::Polystar::updatePath(Polystar *this,VPath *path,int frameNo)

{
  VPointF VVar1;
  VMatrix *this_00;
  Direction dir;
  float points;
  float innerRadius;
  float radius;
  float innerRoundness;
  float roundness;
  float a;
  float local_58;
  float fStack_54;
  VMatrix local_48;
  
  VVar1 = model::Property<VPointF,_void>::value(&this->mData->mPos,frameNo);
  points = model::Property<float,_void>::value(&this->mData->mPointCount,frameNo);
  innerRadius = model::Property<float,_void>::value(&this->mData->mInnerRadius,frameNo);
  radius = model::Property<float,_void>::value(&this->mData->mOuterRadius,frameNo);
  innerRoundness = model::Property<float,_void>::value(&this->mData->mInnerRoundness,frameNo);
  roundness = model::Property<float,_void>::value(&this->mData->mOuterRoundness,frameNo);
  a = model::Property<float,_void>::value(&this->mData->mRotation,frameNo);
  VPath::reset(path);
  local_48.m11 = 1.0;
  local_48.m12 = 0.0;
  local_48.m13 = 0.0;
  local_48.m21 = 0.0;
  local_48.m22 = 1.0;
  local_48.m23 = 0.0;
  local_48.mtx = 0.0;
  local_48.mty = 0.0;
  local_48.m33 = 1.0;
  local_48.mType = None;
  local_48.dirty = None;
  dir = (Direction)((this->mData->super_Shape).mDirection != 3);
  if (*(int *)&(this->mData->super_Shape).field_0x14 == 1) {
    VPath::addPolystar(path,points,innerRadius,radius,innerRoundness,roundness,0.0,0.0,0.0,dir);
  }
  else {
    VPath::addPolygon(path,points,radius,roundness,0.0,0.0,0.0,dir);
  }
  local_58 = VVar1.mx;
  fStack_54 = VVar1.my;
  this_00 = VMatrix::translate(&local_48,local_58,fStack_54);
  VMatrix::rotate(this_00,a,Z);
  VMatrix::rotate(&local_48,a,Z);
  VPath::transform(path,&local_48);
  return;
}

Assistant:

void renderer::Polystar::updatePath(VPath &path, int frameNo)
{
    VPointF pos = mData->mPos.value(frameNo);
    float   points = mData->mPointCount.value(frameNo);
    float   innerRadius = mData->mInnerRadius.value(frameNo);
    float   outerRadius = mData->mOuterRadius.value(frameNo);
    float   innerRoundness = mData->mInnerRoundness.value(frameNo);
    float   outerRoundness = mData->mOuterRoundness.value(frameNo);
    float   rotation = mData->mRotation.value(frameNo);

    path.reset();
    VMatrix m;

    if (mData->mPolyType == model::Polystar::PolyType::Star) {
        path.addPolystar(points, innerRadius, outerRadius, innerRoundness,
                         outerRoundness, 0.0, 0.0, 0.0, mData->direction());
    } else {
        path.addPolygon(points, outerRadius, outerRoundness, 0.0, 0.0, 0.0,
                        mData->direction());
    }

    m.translate(pos.x(), pos.y()).rotate(rotation);
    m.rotate(rotation);
    path.transform(m);
}